

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O1

Loop * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetLoopForSubscriptPair
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair)

{
  Loop *pLVar1;
  pointer ppSVar2;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_nodes;
  unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  loops;
  Loop *local_c8;
  _Hashtable<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c0;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_b8;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_a0;
  _Hashtable<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_88;
  string local_48;
  
  SENode::CollectRecurrentNodes(&local_a0,subscript_pair->first);
  SENode::CollectRecurrentNodes(&local_b8,subscript_pair->second);
  local_88._M_buckets = &local_88._M_single_bucket;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_bucket_count = 1;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._4_4_ = 0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  if (local_a0.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppSVar2 = local_a0.
              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_c8 = (*ppSVar2)->loop_;
      local_c0 = &local_88;
      std::
      _Hashtable<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::allocator<spvtools::opt::Loop_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Loop_const*>,std::hash<spvtools::opt::Loop_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Loop_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Loop_const*,false>>>>
                ((_Hashtable<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::allocator<spvtools::opt::Loop_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Loop_const*>,std::hash<spvtools::opt::Loop_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_88,&local_c8,&local_c0);
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 !=
             local_a0.
             super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_b8.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppSVar2 = local_b8.
              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_c8 = (*ppSVar2)->loop_;
      local_c0 = &local_88;
      std::
      _Hashtable<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::allocator<spvtools::opt::Loop_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Loop_const*>,std::hash<spvtools::opt::Loop_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Loop_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Loop_const*,false>>>>
                ((_Hashtable<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::allocator<spvtools::opt::Loop_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Loop_const*>,std::hash<spvtools::opt::Loop_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_88,&local_c8,&local_c0);
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 !=
             local_b8.
             super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_88._M_element_count == 1) {
    pLVar1 = (Loop *)local_88._M_before_begin._M_nxt[1]._M_nxt;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"GetLoopForSubscriptPair found loops.size() != 1.","");
    PrintDebug(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pLVar1 = (Loop *)0x0;
  }
  std::
  _Hashtable<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_88);
  if (local_b8.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pLVar1;
}

Assistant:

const Loop* LoopDependenceAnalysis::GetLoopForSubscriptPair(
    const std::pair<SENode*, SENode*>& subscript_pair) {
  // Collect all the SERecurrentNodes.
  std::vector<SERecurrentNode*> source_nodes =
      std::get<0>(subscript_pair)->CollectRecurrentNodes();
  std::vector<SERecurrentNode*> destination_nodes =
      std::get<1>(subscript_pair)->CollectRecurrentNodes();

  // Collect all the loops stored by the SERecurrentNodes.
  std::unordered_set<const Loop*> loops{};
  for (auto source_nodes_it = source_nodes.begin();
       source_nodes_it != source_nodes.end(); ++source_nodes_it) {
    loops.insert((*source_nodes_it)->GetLoop());
  }
  for (auto destination_nodes_it = destination_nodes.begin();
       destination_nodes_it != destination_nodes.end();
       ++destination_nodes_it) {
    loops.insert((*destination_nodes_it)->GetLoop());
  }

  // If we didn't find 1 loop |subscript_pair| is a subscript over multiple or 0
  // loops. We don't handle this so return nullptr.
  if (loops.size() != 1) {
    PrintDebug("GetLoopForSubscriptPair found loops.size() != 1.");
    return nullptr;
  }
  return *loops.begin();
}